

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer puVar1;
  char cVar2;
  int iVar3;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar4;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  bool bVar5;
  bool bVar6;
  
  bVar5 = (testCase->properties & IsHidden) == None;
  puVar4 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = puVar4 == puVar1;
  if (!bVar6) {
    iVar3 = (*puVar4->m_ptr->_vptr_Pattern[2])(puVar4->m_ptr,testCase);
    bVar5 = true;
    cVar2 = (char)iVar3;
    while (cVar2 != '\0') {
      puVar4 = puVar4 + 1;
      bVar6 = puVar4 == puVar1;
      if (bVar6) break;
      iVar3 = (*puVar4->m_ptr->_vptr_Pattern[2])(puVar4->m_ptr,testCase);
      cVar2 = (char)iVar3;
    }
  }
  if (bVar6) {
    puVar1 = (this->m_forbidden).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->m_forbidden).
                  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      iVar3 = (*puVar4->m_ptr->_vptr_Pattern[2])(puVar4->m_ptr,testCase);
      if ((char)iVar3 != '\0') goto LAB_00141380;
    }
  }
  else {
LAB_00141380:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }